

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ChainstateRole *role)

{
  ChainstateRole CVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CVar1 = *role;
  if (CVar1 == ASSUMEDVALID) {
    pcVar3 = "assumedvalid";
  }
  else if (CVar1 == BACKGROUND) {
    pcVar3 = "background";
  }
  else {
    if (CVar1 != NORMAL) {
      std::ios::setstate((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
      goto LAB_003dbed0;
    }
    pcVar3 = "normal";
  }
  std::operator<<(os,pcVar3);
LAB_003dbed0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ChainstateRole& role) {
    switch(role) {
        case ChainstateRole::NORMAL: os << "normal"; break;
        case ChainstateRole::ASSUMEDVALID: os << "assumedvalid"; break;
        case ChainstateRole::BACKGROUND: os << "background"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}